

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O0

Gia_Man_t * Cec_ManCombSpecReduce(Gia_Man_t *p,Vec_Int_t **pvOutputs,int fRings)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  bool bVar10;
  int local_114;
  int iObjNew;
  int iPrevNew;
  int iObj;
  int iPrev;
  int i;
  Vec_Int_t *vXorLits;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fRings_local;
  Vec_Int_t **pvOutputs_local;
  Gia_Man_t *p_local;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecChoice.c"
                  ,0x66,"Gia_Man_t *Cec_ManCombSpecReduce(Gia_Man_t *, Vec_Int_t **, int)");
  }
  Gia_ManSetPhase(p);
  Gia_ManFillValue(p);
  iVar2 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar2);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar6;
  Gia_ManHashAlloc(p_00);
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 0;
  iObj = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCis);
    bVar10 = false;
    if (iObj < iVar2) {
      pRepr = Gia_ManCi(p,iObj);
      bVar10 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    uVar4 = Gia_ManAppendCi(p_00);
    pRepr->Value = uVar4;
    iObj = iObj + 1;
  }
  pVVar8 = Vec_IntAlloc(1000);
  *pvOutputs = pVVar8;
  pVVar8 = Vec_IntAlloc(1000);
  if (fRings == 0) {
    iObj = 1;
    while( true ) {
      bVar10 = false;
      if (iObj < p->nObjs) {
        pRepr = Gia_ManObj(p,iObj);
        bVar10 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar2 = Gia_ObjId(p,pRepr);
      pGVar7 = Gia_ObjReprObj(p,iVar2);
      if (pGVar7 != (Gia_Obj_t *)0x0) {
        iVar2 = Gia_ObjIsConst(p,iObj);
        if (iVar2 == 0) {
          local_114 = Cec_ManCombSpecReal(p_00,p,pGVar7);
        }
        else {
          local_114 = 0;
        }
        iVar2 = Cec_ManCombSpecReal(p_00,p,pRepr);
        uVar4 = Gia_ObjPhase(pGVar7);
        uVar5 = Gia_ObjPhase(pRepr);
        iVar2 = Abc_LitNotCond(iVar2,uVar4 ^ uVar5);
        if (local_114 != iVar2) {
          pVVar1 = *pvOutputs;
          iVar3 = Gia_ObjId(p,pGVar7);
          Vec_IntPush(pVVar1,iVar3);
          pVVar1 = *pvOutputs;
          iVar3 = Gia_ObjId(p,pRepr);
          Vec_IntPush(pVVar1,iVar3);
          iVar2 = Gia_ManHashXor(p_00,local_114,iVar2);
          Vec_IntPush(pVVar8,iVar2);
        }
      }
      iObj = iObj + 1;
    }
  }
  else {
    iObj = 1;
    while( true ) {
      bVar10 = false;
      if (iObj < p->nObjs) {
        pRepr = Gia_ManObj(p,iObj);
        bVar10 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar2 = Gia_ObjIsConst(p,iObj);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsHead(p,iObj);
        if (iVar2 != 0) {
          iPrevNew = iObj;
          iVar2 = Gia_ObjIsHead(p,iObj);
          if (iVar2 == 0) {
            __assert_fail("Gia_ObjIsHead(p, i)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecChoice.c"
                          ,0x84,"Gia_Man_t *Cec_ManCombSpecReduce(Gia_Man_t *, Vec_Int_t **, int)");
          }
          for (iObjNew = Gia_ObjNext(p,iObj); iObjNew != 0; iObjNew = Gia_ObjNext(p,iObjNew)) {
            pGVar7 = Gia_ManObj(p,iPrevNew);
            iVar2 = Cec_ManCombSpecReal(p_00,p,pGVar7);
            pGVar7 = Gia_ManObj(p,iObjNew);
            iVar3 = Cec_ManCombSpecReal(p_00,p,pGVar7);
            uVar4 = Gia_ObjPhase(pRepr);
            pGVar7 = Gia_ManObj(p,iPrevNew);
            uVar5 = Gia_ObjPhase(pGVar7);
            iVar2 = Abc_LitNotCond(iVar2,uVar4 ^ uVar5);
            uVar4 = Gia_ObjPhase(pRepr);
            pGVar7 = Gia_ManObj(p,iObjNew);
            uVar5 = Gia_ObjPhase(pGVar7);
            iVar3 = Abc_LitNotCond(iVar3,uVar4 ^ uVar5);
            if (((iVar2 != iVar3) && (iVar2 != 0)) && (iVar3 != 1)) {
              Vec_IntPush(*pvOutputs,iPrevNew);
              Vec_IntPush(*pvOutputs,iObjNew);
              iVar3 = Abc_LitNot(iVar3);
              iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
              Vec_IntPush(pVVar8,iVar2);
            }
            iPrevNew = iObjNew;
          }
          pGVar7 = Gia_ManObj(p,iPrevNew);
          iVar2 = Cec_ManCombSpecReal(p_00,p,pGVar7);
          pGVar7 = Gia_ManObj(p,iObj);
          iVar3 = Cec_ManCombSpecReal(p_00,p,pGVar7);
          uVar4 = Gia_ObjPhase(pRepr);
          pGVar7 = Gia_ManObj(p,iPrevNew);
          uVar5 = Gia_ObjPhase(pGVar7);
          iVar2 = Abc_LitNotCond(iVar2,uVar4 ^ uVar5);
          uVar4 = Gia_ObjPhase(pRepr);
          pGVar7 = Gia_ManObj(p,iObj);
          uVar5 = Gia_ObjPhase(pGVar7);
          iVar3 = Abc_LitNotCond(iVar3,uVar4 ^ uVar5);
          if (((iVar2 != iVar3) && (iVar2 != 0)) && (iVar3 != 1)) {
            Vec_IntPush(*pvOutputs,iPrevNew);
            Vec_IntPush(*pvOutputs,iObj);
            iVar3 = Abc_LitNot(iVar3);
            iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
            Vec_IntPush(pVVar8,iVar2);
          }
        }
      }
      else {
        iVar2 = Cec_ManCombSpecReal(p_00,p,pRepr);
        iVar3 = Gia_ObjPhase(pRepr);
        iVar2 = Abc_LitNotCond(iVar2,iVar3);
        if (iVar2 != 0) {
          Vec_IntPush(*pvOutputs,0);
          Vec_IntPush(*pvOutputs,iObj);
          Vec_IntPush(pVVar8,iVar2);
        }
      }
      iObj = iObj + 1;
    }
  }
  for (iObj = 0; iVar2 = Vec_IntSize(pVVar8), iObj < iVar2; iObj = iObj + 1) {
    iVar2 = Vec_IntEntry(pVVar8,iObj);
    Gia_ManAppendCo(p_00,iVar2);
  }
  Vec_IntFree(pVVar8);
  Gia_ManHashStop(p_00);
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Cec_ManCombSpecReduce( Gia_Man_t * p, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int i, iPrev, iObj, iPrevNew, iObjNew;
    assert( p->pReprs != NULL );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Cec_ManCombSpecReal( pNew, p, pObj );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                    iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Cec_ManCombSpecReal( pNew, p, pRepr );
            iObjNew  = Cec_ManCombSpecReal( pNew, p, pObj );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}